

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::moveLp(HEkk *this,HighsLpSolverObject *solver_object)

{
  long lVar1;
  long *in_RSI;
  HEkk *in_RDI;
  HighsLp *incumbent_lp;
  HighsLp *in_stack_ffffffffffffffd8;
  
  lVar1 = *in_RSI;
  HighsLp::operator=((HighsLp *)in_RDI,in_stack_ffffffffffffffd8);
  *(undefined1 *)(lVar1 + 0x251) = 1;
  (in_RDI->status_).has_ar_matrix = false;
  in_RDI->simplex_in_scaled_space_ = (bool)((in_RDI->lp_).is_scaled_ & 1);
  setPointers(in_RDI,(HighsCallback *)in_RSI[5],(HighsOptions *)in_RSI[6],(HighsTimer *)in_RSI[7]);
  initialiseEkk(in_RDI);
  return;
}

Assistant:

void HEkk::moveLp(HighsLpSolverObject& solver_object) {
  // Move the incumbent LP to EKK
  HighsLp& incumbent_lp = solver_object.lp_;
  this->lp_ = std::move(incumbent_lp);
  incumbent_lp.is_moved_ = true;
  //
  // Invalidate the row-wise matrix
  this->status_.has_ar_matrix = false;
  //
  // The simplex algorithm runs in the same space as the LP that has
  // just been moved in. This is a scaled space if the LP is scaled.
  this->simplex_in_scaled_space_ = this->lp_.is_scaled_;
  //
  // Update other EKK pointers. Currently just pointers to the
  // HighsOptions and HighsTimer members of the Highs class that are
  // communicated by reference via the HighsLpSolverObject instance.
  this->setPointers(&solver_object.callback_, &solver_object.options_,
                    &solver_object.timer_);
  // Initialise Ekk if this has not been done. Ekk isn't initialised
  // if moveLp hasn't been called for this instance of HiGHS, or if
  // the Ekk instance is junked due to removing rows from the LP
  this->initialiseEkk();
}